

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::javanano::HasMapField(Descriptor *descriptor)

{
  long lVar1;
  Type TVar2;
  Descriptor *pDVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  
  bVar4 = 0 < *(int *)(descriptor + 0x2c);
  if (0 < *(int *)(descriptor + 0x2c)) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(descriptor + 0x30);
      TVar2 = FieldDescriptor::type((FieldDescriptor *)(lVar1 + lVar6));
      if (((TVar2 == TYPE_MESSAGE) &&
          (pDVar3 = FieldDescriptor::message_type((FieldDescriptor *)(lVar1 + lVar6)),
          *(char *)(*(long *)(pDVar3 + 0x20) + 0x6b) == '\x01')) &&
         (*(int *)(*(long *)(pDVar3 + 0x10) + 0x8c) == 3)) {
        return bVar4;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0xa8;
      bVar4 = lVar5 < *(int *)(descriptor + 0x2c);
    } while (lVar5 < *(int *)(descriptor + 0x2c));
  }
  return bVar4;
}

Assistant:

bool HasMapField(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    const FieldDescriptor* field = descriptor->field(i);
    if (field->type() == FieldDescriptor::TYPE_MESSAGE &&
        IsMapEntry(field->message_type())) {
      return true;
    }
  }
  return false;
}